

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yyStackOverflow(yyParser *yypParser,YYMINORTYPE *yypMinor)

{
  Parse *pParse_00;
  Parse *pParse;
  YYMINORTYPE *yypMinor_local;
  yyParser *yypParser_local;
  
  pParse_00 = yypParser->pParse;
  yypParser->yyidx = yypParser->yyidx + -1;
  while (-1 < yypParser->yyidx) {
    yy_pop_parser_stack(yypParser);
  }
  sqlite3ErrorMsg(pParse_00,"parser stack overflow");
  yypParser->pParse = pParse_00;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser, YYMINORTYPE *yypMinor){
   sqlite3ParserARG_FETCH;
   yypParser->yyidx--;
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yyidx>=0 ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */

  UNUSED_PARAMETER(yypMinor); /* Silence some compiler warnings */
  sqlite3ErrorMsg(pParse, "parser stack overflow");
   sqlite3ParserARG_STORE; /* Suppress warning about unused %extra_argument var */
}